

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::HandleEquality
          (LoopPeelingInfo *this,SExpression lhs,SExpression rhs)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar2;
  Direction DVar3;
  SENode *pSVar4;
  ScalarEvolutionAnalysis *extraout_RDX;
  SENode *pSVar5;
  Direction DVar6;
  SENode *pSVar7;
  SExpression SVar8;
  SExpression SVar9;
  SExpression local_38;
  
  pSVar2 = rhs.node_;
  pSVar5 = lhs.node_;
  iVar1 = (*pSVar5->_vptr_SENode[6])(pSVar5,pSVar5,lhs.scev_,pSVar2,rhs.scev_);
  pSVar7 = pSVar5;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    SExpression::SExpression(&local_38,*(SENode **)(CONCAT44(extraout_var,iVar1) + 0x38));
    pSVar7 = local_38.node_;
  }
  iVar1 = (*pSVar2->_vptr_SENode[6])(pSVar2);
  pSVar4 = pSVar2;
  if (CONCAT44(extraout_var_00,iVar1) != 0) {
    SExpression::SExpression(&local_38,*(SENode **)(CONCAT44(extraout_var_00,iVar1) + 0x38));
    pSVar4 = local_38.node_;
  }
  DVar6.first = kBefore;
  DVar6.second = 1;
  if (pSVar7 != pSVar4) {
    iVar1 = (*pSVar5->_vptr_SENode[6])(pSVar5);
    SVar8.scev_ = extraout_RDX;
    SVar8.node_ = pSVar5;
    if ((SERecurrentNode *)CONCAT44(extraout_var_01,iVar1) != (SERecurrentNode *)0x0) {
      SVar8 = GetValueAtLastIteration(this,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar1));
    }
    iVar1 = (*pSVar2->_vptr_SENode[6])(pSVar2);
    if ((SERecurrentNode *)CONCAT44(extraout_var_02,iVar1) != (SERecurrentNode *)0x0) {
      SVar9 = GetValueAtLastIteration(this,(SERecurrentNode *)CONCAT44(extraout_var_02,iVar1));
      pSVar2 = SVar9.node_;
    }
    DVar6.first = kAfter;
    DVar6.second = 1;
    DVar3.first = kNone;
    DVar3.second = 0;
    if (SVar8.node_ != pSVar2) {
      DVar6 = DVar3;
    }
  }
  return DVar6;
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::HandleEquality(SExpression lhs,
                                                 SExpression rhs) const {
  {
    // Try peel before opportunity.
    SExpression lhs_cst = lhs;
    if (SERecurrentNode* rec_node = lhs->AsSERecurrentNode()) {
      lhs_cst = rec_node->GetOffset();
    }
    SExpression rhs_cst = rhs;
    if (SERecurrentNode* rec_node = rhs->AsSERecurrentNode()) {
      rhs_cst = rec_node->GetOffset();
    }

    if (lhs_cst == rhs_cst) {
      return Direction{LoopPeelingPass::PeelDirection::kBefore, 1};
    }
  }

  {
    // Try peel after opportunity.
    SExpression lhs_cst = lhs;
    if (SERecurrentNode* rec_node = lhs->AsSERecurrentNode()) {
      // rec_node(x) = a * x + b
      // assign to lhs: a * (loop_max_iterations_ - 1) + b
      lhs_cst = GetValueAtLastIteration(rec_node);
    }
    SExpression rhs_cst = rhs;
    if (SERecurrentNode* rec_node = rhs->AsSERecurrentNode()) {
      // rec_node(x) = a * x + b
      // assign to lhs: a * (loop_max_iterations_ - 1) + b
      rhs_cst = GetValueAtLastIteration(rec_node);
    }

    if (lhs_cst == rhs_cst) {
      return Direction{LoopPeelingPass::PeelDirection::kAfter, 1};
    }
  }

  return GetNoneDirection();
}